

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O1

int GetSentenceVector(void *hPtr,char *input,float **vector)

{
  int iVar1;
  float *__dest;
  Vector svec;
  istringstream inStream;
  allocator<char> local_1d1;
  Vector local_1d0;
  long *local_1c0 [2];
  long local_1b0 [2];
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  iVar1 = fasttext::FastText::getDimension((FastText *)hPtr);
  fasttext::Vector::Vector(&local_1d0,(long)iVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,input,&local_1d1);
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)local_1c0,_S_in);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  fasttext::FastText::getSentenceVector((FastText *)hPtr,(istream *)local_1a0,&local_1d0);
  __dest = (float *)operator_new__(-(ulong)(local_1d0.data_.size_ >> 0x3e != 0) |
                                   local_1d0.data_.size_ * 4);
  memcpy(__dest,local_1d0.data_.mem_,local_1d0.data_.size_ * 4);
  *vector = __dest;
  std::__cxx11::istringstream::~istringstream(local_1a0);
  std::ios_base::~ios_base(local_128);
  free(local_1d0.data_.mem_);
  return (int)local_1d0.data_.size_;
}

Assistant:

GetSentenceVector(void* hPtr, const char* input, float** vector)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    Vector svec(fastText->getDimension());
    std::istringstream inStream(input);

    try {
        fastText->getSentenceVector(inStream, svec);
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    auto vec = new float[svec.size()];
    size_t sz = sizeof(float)*svec.size();
    memcpy(vec, svec.data(), sz);

    *vector = vec;

    return (int) svec.size();
}